

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<std::vector<char8_t,std::allocator<char8_t>>>
               (vector<char8_t,_std::allocator<char8_t>_> *value,ostream *os)

{
  ostream *os_local;
  vector<char8_t,_std::allocator<char8_t>_> *value_local;
  
  ContainerPrinter::PrintValue<std::vector<char8_t,std::allocator<char8_t>>,void>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}